

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O2

void __thiscall
cmDebugServerJson::cmDebugServerJson(cmDebugServerJson *this,cmDebugger *debugger,string *name)

{
  cmPipeConnection *this_00;
  cmConnectionBufferStrategy *bufferStrategy;
  
  this_00 = (cmPipeConnection *)operator_new(0x88);
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(0x28);
  bufferStrategy[4]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[2]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[3]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy->_vptr_cmConnectionBufferStrategy =
       (_func_int **)&PTR__cmServerBufferStrategy_006321f0;
  bufferStrategy[1]._vptr_cmConnectionBufferStrategy = (_func_int **)(bufferStrategy + 3);
  *(undefined1 *)&bufferStrategy[3]._vptr_cmConnectionBufferStrategy = 0;
  cmPipeConnection::cmPipeConnection(this_00,name,bufferStrategy);
  cmDebugServerJson(this,debugger,(cmConnection *)this_00);
  return;
}

Assistant:

cmDebugServerJson::cmDebugServerJson(cmDebugger& debugger,
                                     const std::string& name)
  : cmDebugServerJson(debugger,
                      new cmPipeConnection(name, new cmServerBufferStrategy()))
{
}